

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::PrepareVisitor::internalVisit(PrepareVisitor *this,RigidBody *rb)

{
  pointer ppAVar1;
  PrepareVisitor *this_00;
  shared_ptr<OpenMD::GenericData> data;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> myAtoms;
  shared_ptr<OpenMD::AtomData> atomData;
  allocator<char> local_89;
  undefined1 local_88 [32];
  undefined1 local_68 [16];
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_58;
  _Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_48;
  __shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_58._M_ptr = (element_type *)0x0;
  local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"VISITED",&local_89);
  StuntDouble::getPropertyByName((StuntDouble *)local_68,(string *)rb);
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_58,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  std::__cxx11::string::~string((string *)local_88);
  if (local_58._M_ptr != (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"VISITED",(allocator<char> *)local_68);
    StuntDouble::removeProperty(&rb->super_StuntDouble,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"ATOMDATA",&local_89);
  StuntDouble::getPropertyByName((StuntDouble *)local_68,(string *)rb);
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_58,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  std::__cxx11::string::~string((string *)local_88);
  if (local_58._M_ptr != (element_type *)0x0) {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>
              ((shared_ptr<OpenMD::GenericData> *)local_88);
    std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_28,(__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    if (local_28._M_ptr != (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,"ATOMDATA",(allocator<char> *)local_68);
      StuntDouble::removeProperty(&rb->super_StuntDouble,(string *)local_88);
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)local_88,&rb->atoms_);
  this_00 = (PrepareVisitor *)local_88;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::_M_move_assign
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&local_48,this_00);
  std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
            ((_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)this_00);
  for (ppAVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
      ppAVar1 != local_48._M_impl.super__Vector_impl_data._M_finish; ppAVar1 = ppAVar1 + 1) {
    internalVisit(this_00,*ppAVar1);
  }
  std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return;
}

Assistant:

void PrepareVisitor::internalVisit(RigidBody* rb) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::vector<Atom*> myAtoms;
    std::vector<Atom*>::iterator atomIter;

    // if visited property is  existed, remove it
    data = rb->getPropertyByName("VISITED");

    if (data != nullptr) { rb->removeProperty("VISITED"); }

    // remove atomdata
    data = rb->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData != NULL) rb->removeProperty("ATOMDATA");
    }

    myAtoms = rb->getAtoms();

    for (atomIter = myAtoms.begin(); atomIter != myAtoms.end(); ++atomIter)
      internalVisit(*atomIter);
  }